

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyCleanStyle(TidyDocImpl *doc,Node *html)

{
  ulong uVar1;
  Node *head_00;
  Node *node;
  Bool fix;
  Node *body;
  Node *head;
  Node *html_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x52].v;
  if (html != (Node *)0x0) {
    head_00 = prvTidyFindHEAD(doc);
    node = prvTidyFindBody(doc);
    if ((head_00 != (Node *)0x0) && (node != (Node *)0x0)) {
      StyleToHead(doc,head_00,node,(Bool)uVar1,0);
    }
  }
  return;
}

Assistant:

void TY_(CleanStyle)(TidyDocImpl* doc, Node *html)
{
    Node *head = NULL, *body = NULL;
    Bool fix = cfgBool(doc, TidyStyleTags);

    if (!html)
        return; /* oops, not given a start node */

    head = TY_(FindHEAD)( doc );
    body = TY_(FindBody)( doc );

    if ((head != NULL) && (body != NULL))
    {
		StyleToHead(doc, head, body, fix, 0); /* found head and body */
    }
}